

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_node_bamg_met(REF_GRID ref_grid,FILE *file)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  void *__s;
  void *output;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  REF_STATUS ref_private_macro_code_rxs;
  char *pcVar10;
  ulong uVar11;
  double dVar12;
  REF_INT local;
  uint local_7c;
  int local_64;
  long local_60;
  REF_MPI local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  FILE *local_38;
  
  if (ref_grid->twod == 0) {
    pcVar10 = "only implemented for twod mesh";
    uVar6 = 0x541;
  }
  else {
    pRVar1 = ref_grid->mpi;
    ref_node = ref_grid->node;
    if (pRVar1->id == 0) {
      fprintf((FILE *)file,"%ld %d\n",ref_node->old_n_global,3);
    }
    uVar2 = (int)(ref_node->old_n_global / (long)pRVar1->n) + 1;
    uVar3 = 0x7fffffff;
    if (0 < pRVar1->reduce_byte_limit) {
      uVar3 = (uint)pRVar1->reduce_byte_limit / 0x38;
    }
    if ((int)uVar2 < (int)uVar3) {
      uVar3 = uVar2;
    }
    if (-1 < (int)uVar3) {
      uVar2 = uVar3 * 7;
      local_38 = (FILE *)file;
      __s = malloc((ulong)uVar2 << 3);
      if (__s == (void *)0x0) {
        pcVar10 = "malloc local_xyzm of REF_DBL NULL";
        uVar6 = 0x54b;
      }
      else {
        output = malloc((ulong)uVar2 << 3);
        if (output != (void *)0x0) {
          lVar9 = ref_node->old_n_global;
          local_58 = pRVar1;
          if (0 < lVar9) {
            uVar4 = 1;
            if (1 < (int)uVar2) {
              uVar4 = (ulong)uVar2;
            }
            local_50 = uVar4 << 3;
            lVar8 = 0;
            local_48 = (ulong)uVar3;
            local_40 = (ulong)uVar3;
            do {
              uVar4 = lVar9 - lVar8;
              if ((long)local_40 < lVar9 - lVar8) {
                uVar4 = local_48;
              }
              if ((int)local_48 != 0) {
                memset(__s,0,local_50);
              }
              iVar7 = (int)uVar4;
              local_60 = lVar8;
              if (0 < iVar7) {
                uVar11 = 0;
                do {
                  uVar3 = ref_node_local(ref_node,lVar8,&local_64);
                  if ((uVar3 != 0) && (uVar3 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x55b,"ref_gather_node_bamg_met",(ulong)uVar3,"node local failed");
                    local_7c = uVar3;
                  }
                  if (uVar3 == 5) {
LAB_0017d7b6:
                    puVar5 = (undefined8 *)((uVar11 & 0x7fffffff8) + (long)__s);
                    puVar5[4] = 0;
                    puVar5[5] = 0;
                    puVar5[2] = 0;
                    puVar5[3] = 0;
                    *puVar5 = 0;
                    puVar5[1] = 0;
                    puVar5[6] = 0;
                  }
                  else {
                    if (uVar3 != 0) {
                      return local_7c;
                    }
                    if (local_58->id != ref_node->part[local_64]) goto LAB_0017d7b6;
                    uVar3 = ref_node_metric_get(ref_node,local_64,(REF_DBL *)((long)__s + uVar11));
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x55e,"ref_gather_node_bamg_met",(ulong)uVar3,"get");
                      return uVar3;
                    }
                    *(undefined8 *)((long)__s + uVar11 + 0x30) = 0x3ff0000000000000;
                  }
                  uVar11 = uVar11 + 0x38;
                  lVar8 = lVar8 + 1;
                } while ((uVar4 & 0xffffffff) * 0x38 - uVar11 != 0);
              }
              pRVar1 = local_58;
              uVar3 = ref_mpi_sum(local_58,__s,output,iVar7 * 7,3);
              __stream = local_38;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x565,"ref_gather_node_bamg_met",(ulong)uVar3,"sum");
                return uVar3;
              }
              if ((pRVar1->id == 0) && (0 < iVar7)) {
                lVar8 = 0;
                lVar9 = local_60;
                do {
                  dVar12 = *(double *)((long)output + lVar8 + 0x30) + -1.0;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  if (0.1 < dVar12) {
                    printf("error gather node %ld %f\n",lVar9);
                  }
                  fprintf(__stream,"%.15e %.15e %.15e\n",(int)*(undefined8 *)((long)output + lVar8),
                          *(undefined8 *)((long)output + lVar8 + 8),
                          *(undefined8 *)((long)output + lVar8 + 0x18));
                  lVar8 = lVar8 + 0x38;
                  lVar9 = lVar9 + 1;
                } while ((uVar4 & 0xffffffff) * 0x38 - lVar8 != 0);
              }
              lVar8 = local_60 + iVar7;
              lVar9 = ref_node->old_n_global;
            } while (lVar8 < lVar9);
          }
          free(output);
          free(__s);
          return 0;
        }
        pcVar10 = "malloc xyzm of REF_DBL NULL";
        uVar6 = 0x54c;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar6,"ref_gather_node_bamg_met",pcVar10);
      return 2;
    }
    pcVar10 = "malloc local_xyzm of REF_DBL negative";
    uVar6 = 0x54b;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
         "ref_gather_node_bamg_met",pcVar10);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_bamg_met(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;

  RAS(ref_grid_twod(ref_grid), "only implemented for twod mesh");

  if (ref_mpi_once(ref_mpi)) {
    fprintf(file, "%ld %d\n", (long)ref_node_n_global(ref_node), 3);
  }

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        fprintf(file, "%.15e %.15e %.15e\n", xyzm[0 + 7 * i], xyzm[1 + 7 * i],
                xyzm[3 + 7 * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}